

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  float fVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Geometry *pGVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  NodeRef *pNVar20;
  AABBNodeMB4D *node1;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  size_t sVar39;
  ulong uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  uint uVar66;
  uint uVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  NodeRef *local_14f8;
  float old_t;
  undefined1 local_14c8 [16];
  Geometry *local_14b0;
  ulong local_14a8;
  ulong local_14a0;
  NodeRef *local_1498;
  Scene *scene;
  ulong local_1488;
  long local_1480;
  RTCFilterFunctionNArguments args;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  byte local_1337;
  float local_1328 [4];
  undefined1 local_1318 [16];
  float local_1308 [4];
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [16];
  RTCHitN local_12c8 [16];
  undefined1 local_12b8 [16];
  undefined1 local_12a8 [16];
  undefined1 local_1298 [16];
  undefined1 local_1288 [16];
  undefined1 local_1278 [16];
  undefined1 local_1268 [16];
  uint local_1258;
  uint uStack_1254;
  uint uStack_1250;
  uint uStack_124c;
  uint uStack_1248;
  uint uStack_1244;
  uint uStack_1240;
  uint uStack_123c;
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  stack[0] = root;
  auVar60 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar76 = ZEXT3264(auVar60);
  auVar61 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar77 = ZEXT3264(auVar61);
  auVar62 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar78 = ZEXT3264(auVar62);
  auVar41 = vmulss_avx512f(auVar60._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  uVar26 = auVar41._0_4_;
  auVar41 = vmulss_avx512f(auVar61._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  uVar66 = auVar41._0_4_;
  auVar41 = vmulss_avx512f(auVar62._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar67 = auVar41._0_4_;
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar25 = uVar29 ^ 0x20;
  auVar60 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar79 = ZEXT3264(auVar60);
  auVar60 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar80 = ZEXT3264(auVar60);
  local_11f8._0_8_ = CONCAT44(uVar26,uVar26) ^ 0x8000000080000000;
  local_11f8._8_4_ = uVar26 ^ 0x80000000;
  local_11f8._12_4_ = uVar26 ^ 0x80000000;
  local_11f8._16_4_ = uVar26 ^ 0x80000000;
  local_11f8._20_4_ = uVar26 ^ 0x80000000;
  local_11f8._24_4_ = uVar26 ^ 0x80000000;
  local_11f8._28_4_ = uVar26 ^ 0x80000000;
  auVar72 = ZEXT3264(local_11f8);
  local_1218._0_8_ = CONCAT44(uVar66,uVar66) ^ 0x8000000080000000;
  local_1218._8_4_ = uVar66 ^ 0x80000000;
  local_1218._12_4_ = uVar66 ^ 0x80000000;
  local_1218._16_4_ = uVar66 ^ 0x80000000;
  local_1218._20_4_ = uVar66 ^ 0x80000000;
  local_1218._24_4_ = uVar66 ^ 0x80000000;
  local_1218._28_4_ = uVar66 ^ 0x80000000;
  auVar73 = ZEXT3264(local_1218);
  local_1238._0_8_ = CONCAT44(uVar67,uVar67) ^ 0x8000000080000000;
  local_1238._8_4_ = uVar67 ^ 0x80000000;
  local_1238._12_4_ = uVar67 ^ 0x80000000;
  local_1238._16_4_ = uVar67 ^ 0x80000000;
  local_1238._20_4_ = uVar67 ^ 0x80000000;
  local_1238._24_4_ = uVar67 ^ 0x80000000;
  local_1238._28_4_ = uVar67 ^ 0x80000000;
  auVar74 = ZEXT3264(local_1238);
  auVar41 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  pNVar20 = stack + 1;
  local_1488 = uVar29;
LAB_01d9f578:
  do {
    local_1498 = pNVar20;
    if (local_1498 == stack) {
LAB_01d9ff2b:
      return local_1498 != stack;
    }
    local_14f8 = local_1498 + -1;
    sVar39 = local_1498[-1].ptr;
    while ((sVar39 & 8) == 0) {
      uVar21 = sVar39 & 0xfffffffffffffff0;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar65._4_4_ = uVar2;
      auVar65._0_4_ = uVar2;
      auVar65._8_4_ = uVar2;
      auVar65._12_4_ = uVar2;
      auVar65._16_4_ = uVar2;
      auVar65._20_4_ = uVar2;
      auVar65._24_4_ = uVar2;
      auVar65._28_4_ = uVar2;
      auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + uVar29),auVar65,
                                *(undefined1 (*) [32])(uVar21 + 0x40 + uVar29));
      auVar60 = vfmadd213ps_avx512vl(ZEXT1632(auVar53),auVar76._0_32_,auVar72._0_32_);
      auVar61 = vmaxps_avx512vl(auVar79._0_32_,auVar60);
      auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + uVar24),auVar65,
                                *(undefined1 (*) [32])(uVar21 + 0x40 + uVar24));
      auVar59 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + uVar40),auVar65,
                                *(undefined1 (*) [32])(uVar21 + 0x40 + uVar40));
      auVar60 = vfmadd213ps_avx512vl(ZEXT1632(auVar53),auVar77._0_32_,auVar73._0_32_);
      auVar62 = vfmadd213ps_avx512vl(ZEXT1632(auVar59),auVar78._0_32_,auVar74._0_32_);
      auVar60 = vmaxps_avx(auVar60,auVar62);
      auVar60 = vmaxps_avx(auVar61,auVar60);
      auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + uVar25),auVar65,
                                *(undefined1 (*) [32])(uVar21 + 0x40 + uVar25));
      auVar61 = vfmadd213ps_avx512vl(ZEXT1632(auVar53),auVar76._0_32_,auVar72._0_32_);
      auVar62 = vminps_avx512vl(auVar80._0_32_,auVar61);
      auVar53 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + (uVar24 ^ 0x20)),auVar65,
                                *(undefined1 (*) [32])(uVar21 + 0x40 + (uVar24 ^ 0x20)));
      auVar59 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + (uVar40 ^ 0x20)),auVar65,
                                *(undefined1 (*) [32])(uVar21 + 0x40 + (uVar40 ^ 0x20)));
      auVar61 = vfmadd213ps_avx512vl(ZEXT1632(auVar53),auVar77._0_32_,auVar73._0_32_);
      auVar63 = vfmadd213ps_avx512vl(ZEXT1632(auVar59),auVar78._0_32_,auVar74._0_32_);
      auVar61 = vminps_avx(auVar61,auVar63);
      auVar61 = vminps_avx(auVar62,auVar61);
      if (((uint)sVar39 & 7) == 6) {
        uVar17 = vcmpps_avx512vl(auVar60,auVar61,2);
        uVar18 = vcmpps_avx512vl(auVar65,*(undefined1 (*) [32])(uVar21 + 0x1c0),0xd);
        uVar19 = vcmpps_avx512vl(auVar65,*(undefined1 (*) [32])(uVar21 + 0x1e0),1);
        uVar26 = (uint)uVar17 & (uint)uVar18 & (uint)uVar19;
      }
      else {
        uVar17 = vcmpps_avx512vl(auVar60,auVar61,2);
        uVar26 = (uint)uVar17;
      }
      pNVar20 = local_14f8;
      if ((byte)uVar26 == 0) goto LAB_01d9f578;
      lVar23 = 0;
      for (uVar27 = (ulong)(byte)uVar26; (uVar27 & 1) == 0;
          uVar27 = uVar27 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      sVar39 = *(size_t *)(uVar21 + lVar23 * 8);
      uVar26 = (uVar26 & 0xff) - 1 & uVar26 & 0xff;
      uVar27 = (ulong)uVar26;
      if (uVar26 != 0) {
        do {
          local_14f8->ptr = sVar39;
          local_14f8 = local_14f8 + 1;
          lVar23 = 0;
          for (uVar30 = uVar27; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
            lVar23 = lVar23 + 1;
          }
          uVar27 = uVar27 - 1 & uVar27;
          sVar39 = *(size_t *)(uVar21 + lVar23 * 8);
        } while (uVar27 != 0);
      }
    }
    local_1480 = (ulong)((uint)sVar39 & 0xf) - 8;
    uVar21 = sVar39 & 0xfffffffffffffff0;
    for (lVar23 = 0; pNVar20 = local_14f8, lVar23 != local_1480; lVar23 = lVar23 + 1) {
      lVar28 = lVar23 * 0x50;
      scene = context->scene;
      pGVar9 = (scene->geometries).items[*(uint *)(uVar21 + 0x30 + lVar28)].ptr;
      fVar3 = (pGVar9->time_range).lower;
      fVar3 = pGVar9->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar3) / ((pGVar9->time_range).upper - fVar3));
      auVar53 = vroundss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),9);
      auVar53 = vminss_avx(auVar53,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
      auVar13 = vmaxss_avx(ZEXT816(0) << 0x20,auVar53);
      lVar22 = (long)(int)auVar13._0_4_ * 0x38;
      lVar10 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar22);
      auVar53 = *(undefined1 (*) [16])(lVar10 + (ulong)*(uint *)(uVar21 + lVar28) * 4);
      uVar30 = (ulong)*(uint *)(uVar21 + 0x10 + lVar28);
      auVar59 = *(undefined1 (*) [16])(lVar10 + uVar30 * 4);
      uVar31 = (ulong)*(uint *)(uVar21 + 0x20 + lVar28);
      auVar75 = *(undefined1 (*) [16])(lVar10 + uVar31 * 4);
      uVar32 = (ulong)*(uint *)(uVar21 + 4 + lVar28);
      auVar42 = *(undefined1 (*) [16])(lVar10 + uVar32 * 4);
      uVar33 = (ulong)*(uint *)(uVar21 + 0x14 + lVar28);
      auVar54 = *(undefined1 (*) [16])(lVar10 + uVar33 * 4);
      uVar34 = (ulong)*(uint *)(uVar21 + 0x24 + lVar28);
      auVar56 = *(undefined1 (*) [16])(lVar10 + uVar34 * 4);
      uVar37 = (ulong)*(uint *)(uVar21 + 8 + lVar28);
      auVar43 = *(undefined1 (*) [16])(lVar10 + uVar37 * 4);
      uVar38 = (ulong)*(uint *)(uVar21 + 0x18 + lVar28);
      auVar45 = *(undefined1 (*) [16])(lVar10 + uVar38 * 4);
      uVar36 = (ulong)*(uint *)(uVar21 + 0x28 + lVar28);
      auVar57 = *(undefined1 (*) [16])(lVar10 + uVar36 * 4);
      uVar35 = (ulong)*(uint *)(uVar21 + 0xc + lVar28);
      auVar58 = *(undefined1 (*) [16])(lVar10 + uVar35 * 4);
      uVar29 = (ulong)*(uint *)(uVar21 + 0x1c + lVar28);
      auVar55 = *(undefined1 (*) [16])(lVar10 + uVar29 * 4);
      lVar22 = *(long *)(*(long *)&pGVar9[2].numPrimitives + 0x38 + lVar22);
      uVar27 = (ulong)*(uint *)(uVar21 + 0x2c + lVar28);
      auVar44 = *(undefined1 (*) [16])(lVar10 + uVar27 * 4);
      auVar46 = *(undefined1 (*) [16])(lVar22 + (ulong)*(uint *)(uVar21 + lVar28) * 4);
      auVar47 = *(undefined1 (*) [16])(lVar22 + uVar30 * 4);
      auVar50 = *(undefined1 (*) [16])(lVar22 + uVar31 * 4);
      auVar48 = *(undefined1 (*) [16])(lVar22 + uVar32 * 4);
      auVar49 = *(undefined1 (*) [16])(lVar22 + uVar33 * 4);
      auVar51 = *(undefined1 (*) [16])(lVar22 + uVar34 * 4);
      auVar52 = *(undefined1 (*) [16])(lVar22 + uVar37 * 4);
      auVar64 = *(undefined1 (*) [16])(lVar22 + uVar38 * 4);
      auVar5 = *(undefined1 (*) [16])(lVar22 + uVar36 * 4);
      auVar6 = *(undefined1 (*) [16])(lVar22 + uVar35 * 4);
      auVar7 = *(undefined1 (*) [16])(lVar22 + uVar29 * 4);
      auVar8 = *(undefined1 (*) [16])(lVar22 + uVar27 * 4);
      puVar1 = (undefined8 *)(uVar21 + 0x30 + lVar28);
      local_1388 = *puVar1;
      uStack_1380 = puVar1[1];
      puVar1 = (undefined8 *)(uVar21 + 0x40 + lVar28);
      auVar14 = vunpcklps_avx(auVar53,auVar43);
      auVar53 = vunpckhps_avx(auVar53,auVar43);
      auVar43 = vunpcklps_avx(auVar42,auVar58);
      auVar42 = vunpckhps_avx(auVar42,auVar58);
      auVar58 = vunpcklps_avx(auVar53,auVar42);
      auVar15 = vunpcklps_avx(auVar14,auVar43);
      auVar53 = vunpckhps_avx(auVar14,auVar43);
      auVar43 = vunpcklps_avx(auVar59,auVar45);
      auVar59 = vunpckhps_avx(auVar59,auVar45);
      auVar45 = vunpcklps_avx(auVar54,auVar55);
      auVar42 = vunpckhps_avx(auVar54,auVar55);
      auVar54 = vunpcklps_avx(auVar59,auVar42);
      auVar55 = vunpcklps_avx(auVar43,auVar45);
      auVar59 = vunpckhps_avx(auVar43,auVar45);
      auVar43 = vunpcklps_avx(auVar75,auVar57);
      auVar75 = vunpckhps_avx(auVar75,auVar57);
      auVar45 = vunpcklps_avx(auVar56,auVar44);
      auVar42 = vunpckhps_avx(auVar56,auVar44);
      auVar56 = vunpcklps_avx(auVar75,auVar42);
      auVar57 = vunpcklps_avx(auVar43,auVar45);
      auVar75 = vunpckhps_avx(auVar43,auVar45);
      auVar42 = vunpcklps_avx512vl(auVar46,auVar52);
      auVar43 = vunpckhps_avx512vl(auVar46,auVar52);
      auVar44 = vunpcklps_avx512vl(auVar48,auVar6);
      auVar45 = vunpckhps_avx512vl(auVar48,auVar6);
      auVar43 = vunpcklps_avx(auVar43,auVar45);
      auVar45 = vunpcklps_avx(auVar42,auVar44);
      auVar42 = vunpckhps_avx(auVar42,auVar44);
      auVar44 = vunpcklps_avx512vl(auVar47,auVar64);
      auVar46 = vunpckhps_avx512vl(auVar47,auVar64);
      auVar47 = vunpcklps_avx512vl(auVar49,auVar7);
      auVar48 = vunpckhps_avx512vl(auVar49,auVar7);
      auVar46 = vunpcklps_avx512vl(auVar46,auVar48);
      auVar48 = vunpcklps_avx512vl(auVar44,auVar47);
      auVar47 = vunpckhps_avx512vl(auVar44,auVar47);
      auVar49 = vunpcklps_avx512vl(auVar50,auVar5);
      auVar44 = vunpckhps_avx512vl(auVar50,auVar5);
      auVar50 = vunpcklps_avx512vl(auVar51,auVar8);
      auVar51 = vunpckhps_avx512vl(auVar51,auVar8);
      auVar44 = vunpcklps_avx(auVar44,auVar51);
      auVar51 = vunpcklps_avx512vl(auVar49,auVar50);
      auVar50 = vunpckhps_avx512vl(auVar49,auVar50);
      auVar52 = ZEXT416((uint)(fVar3 - auVar13._0_4_));
      auVar49 = vbroadcastss_avx512vl(auVar52);
      auVar52 = vsubss_avx512f(ZEXT416(0x3f800000),auVar52);
      auVar64._0_4_ = auVar52._0_4_;
      auVar64._4_4_ = auVar64._0_4_;
      auVar64._8_4_ = auVar64._0_4_;
      auVar64._12_4_ = auVar64._0_4_;
      auVar45 = vmulps_avx512vl(auVar49,auVar45);
      auVar42 = vmulps_avx512vl(auVar49,auVar42);
      auVar52 = vmulps_avx512vl(auVar49,auVar43);
      auVar43 = vfmadd231ps_fma(auVar45,auVar64,auVar15);
      auVar45 = vfmadd231ps_fma(auVar42,auVar64,auVar53);
      auVar58 = vfmadd231ps_fma(auVar52,auVar64,auVar58);
      auVar53 = vmulps_avx512vl(auVar49,auVar48);
      auVar42 = vmulps_avx512vl(auVar49,auVar47);
      auVar46 = vmulps_avx512vl(auVar49,auVar46);
      auVar53 = vfmadd231ps_fma(auVar53,auVar64,auVar55);
      auVar59 = vfmadd231ps_fma(auVar42,auVar64,auVar59);
      auVar42 = vfmadd231ps_fma(auVar46,auVar64,auVar54);
      auVar54 = vmulps_avx512vl(auVar49,auVar51);
      auVar55 = vmulps_avx512vl(auVar49,auVar50);
      auVar44 = vmulps_avx512vl(auVar49,auVar44);
      auVar54 = vfmadd231ps_fma(auVar54,auVar64,auVar57);
      auVar57 = vfmadd231ps_fma(auVar55,auVar64,auVar75);
      auVar56 = vfmadd231ps_fma(auVar44,auVar64,auVar56);
      local_1398 = *puVar1;
      uStack_1390 = puVar1[1];
      auVar53 = vsubps_avx(auVar43,auVar53);
      auVar59 = vsubps_avx(auVar45,auVar59);
      auVar75 = vsubps_avx(auVar58,auVar42);
      auVar42 = vsubps_avx(auVar54,auVar43);
      auVar54 = vsubps_avx(auVar57,auVar45);
      auVar55 = vsubps_avx512vl(auVar56,auVar58);
      auVar56 = vmulps_avx512vl(auVar59,auVar55);
      local_12f8 = vfmsub231ps_fma(auVar56,auVar54,auVar75);
      auVar44._0_4_ = auVar75._0_4_ * auVar42._0_4_;
      auVar44._4_4_ = auVar75._4_4_ * auVar42._4_4_;
      auVar44._8_4_ = auVar75._8_4_ * auVar42._8_4_;
      auVar44._12_4_ = auVar75._12_4_ * auVar42._12_4_;
      local_12e8 = vfmsub231ps_avx512vl(auVar44,auVar55,auVar53);
      auVar46._0_4_ = auVar53._0_4_ * auVar54._0_4_;
      auVar46._4_4_ = auVar53._4_4_ * auVar54._4_4_;
      auVar46._8_4_ = auVar53._8_4_ * auVar54._8_4_;
      auVar46._12_4_ = auVar53._12_4_ * auVar54._12_4_;
      fVar3 = *(float *)(ray + k * 4 + 0x40);
      auVar50._4_4_ = fVar3;
      auVar50._0_4_ = fVar3;
      auVar50._8_4_ = fVar3;
      auVar50._12_4_ = fVar3;
      fVar68 = *(float *)(ray + k * 4 + 0x50);
      auVar48._4_4_ = fVar68;
      auVar48._0_4_ = fVar68;
      auVar48._8_4_ = fVar68;
      auVar48._12_4_ = fVar68;
      auVar57 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
      uVar2 = *(undefined4 *)(ray + k * 4);
      auVar56._4_4_ = uVar2;
      auVar56._0_4_ = uVar2;
      auVar56._8_4_ = uVar2;
      auVar56._12_4_ = uVar2;
      auVar44 = vsubps_avx512vl(auVar43,auVar56);
      local_12d8 = vfmsub231ps_fma(auVar46,auVar42,auVar59);
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar43._4_4_ = uVar2;
      auVar43._0_4_ = uVar2;
      auVar43._8_4_ = uVar2;
      auVar43._12_4_ = uVar2;
      auVar46 = vsubps_avx512vl(auVar45,auVar43);
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar45._4_4_ = uVar2;
      auVar45._0_4_ = uVar2;
      auVar45._8_4_ = uVar2;
      auVar45._12_4_ = uVar2;
      auVar45 = vsubps_avx512vl(auVar58,auVar45);
      auVar47._0_4_ = fVar68 * auVar45._0_4_;
      auVar47._4_4_ = fVar68 * auVar45._4_4_;
      auVar47._8_4_ = fVar68 * auVar45._8_4_;
      auVar47._12_4_ = fVar68 * auVar45._12_4_;
      auVar47 = vfmsub231ps_avx512vl(auVar47,auVar46,auVar57);
      auVar56 = vmulps_avx512vl(auVar57,auVar44);
      auVar56 = vfmsub231ps_fma(auVar56,auVar45,auVar50);
      auVar49._0_4_ = fVar3 * auVar46._0_4_;
      auVar49._4_4_ = fVar3 * auVar46._4_4_;
      auVar49._8_4_ = fVar3 * auVar46._8_4_;
      auVar49._12_4_ = fVar3 * auVar46._12_4_;
      auVar43 = vfmsub231ps_fma(auVar49,auVar44,auVar48);
      auVar57 = vmulps_avx512vl(local_12d8,auVar57);
      auVar57 = vfmadd231ps_avx512vl(auVar57,local_12e8,auVar48);
      auVar50 = vfmadd231ps_avx512vl(auVar57,local_12f8,auVar50);
      auVar57._8_4_ = 0x7fffffff;
      auVar57._0_8_ = 0x7fffffff7fffffff;
      auVar57._12_4_ = 0x7fffffff;
      local_1348 = vandps_avx512vl(auVar50,auVar57);
      auVar58._8_4_ = 0x80000000;
      auVar58._0_8_ = 0x8000000080000000;
      auVar58._12_4_ = 0x80000000;
      auVar57 = vandps_avx512vl(auVar50,auVar58);
      auVar58 = vmulps_avx512vl(auVar55,auVar43);
      auVar54 = vfmadd231ps_avx512vl(auVar58,auVar56,auVar54);
      auVar42 = vfmadd231ps_avx512vl(auVar54,auVar47,auVar42);
      local_1378 = vxorps_avx512vl(auVar57,auVar42);
      auVar42._0_4_ = auVar75._0_4_ * auVar43._0_4_;
      auVar42._4_4_ = auVar75._4_4_ * auVar43._4_4_;
      auVar42._8_4_ = auVar75._8_4_ * auVar43._8_4_;
      auVar42._12_4_ = auVar75._12_4_ * auVar43._12_4_;
      auVar59 = vfmadd231ps_fma(auVar42,auVar59,auVar56);
      auVar53 = vfmadd231ps_fma(auVar59,auVar53,auVar47);
      local_1368._0_4_ = (float)(auVar57._0_4_ ^ auVar53._0_4_);
      local_1368._4_4_ = (float)(auVar57._4_4_ ^ auVar53._4_4_);
      local_1368._8_4_ = (float)(auVar57._8_4_ ^ auVar53._8_4_);
      local_1368._12_4_ = (float)(auVar57._12_4_ ^ auVar53._12_4_);
      auVar53 = ZEXT816(0) << 0x20;
      uVar17 = vcmpps_avx512vl(local_1378,auVar53,5);
      uVar18 = vcmpps_avx512vl(local_1368,auVar53,5);
      uVar19 = vcmpps_avx512vl(auVar50,auVar53,4);
      auVar53._0_4_ = local_1378._0_4_ + local_1368._0_4_;
      auVar53._4_4_ = local_1378._4_4_ + local_1368._4_4_;
      auVar53._8_4_ = local_1378._8_4_ + local_1368._8_4_;
      auVar53._12_4_ = local_1378._12_4_ + local_1368._12_4_;
      uVar16 = vcmpps_avx512vl(auVar53,local_1348,2);
      local_1337 = (byte)uVar17 & (byte)uVar18 & (byte)uVar19 & (byte)uVar16;
      if (local_1337 != 0) {
        auVar75._0_4_ = auVar45._0_4_ * local_12d8._0_4_;
        auVar75._4_4_ = auVar45._4_4_ * local_12d8._4_4_;
        auVar75._8_4_ = auVar45._8_4_ * local_12d8._8_4_;
        auVar75._12_4_ = auVar45._12_4_ * local_12d8._12_4_;
        auVar53 = vfmadd213ps_fma(auVar46,local_12e8,auVar75);
        auVar53 = vfmadd213ps_fma(auVar44,local_12f8,auVar53);
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar59._4_4_ = uVar2;
        auVar59._0_4_ = uVar2;
        auVar59._8_4_ = uVar2;
        auVar59._12_4_ = uVar2;
        auVar59 = vmulps_avx512vl(local_1348,auVar59);
        fVar3 = *(float *)(ray + k * 4 + 0x80);
        local_1358._0_4_ = (float)(auVar57._0_4_ ^ auVar53._0_4_);
        local_1358._4_4_ = (float)(auVar57._4_4_ ^ auVar53._4_4_);
        local_1358._8_4_ = (float)(auVar57._8_4_ ^ auVar53._8_4_);
        local_1358._12_4_ = (float)(auVar57._12_4_ ^ auVar53._12_4_);
        auVar54._0_4_ = fVar3 * local_1348._0_4_;
        auVar54._4_4_ = fVar3 * local_1348._4_4_;
        auVar54._8_4_ = fVar3 * local_1348._8_4_;
        auVar54._12_4_ = fVar3 * local_1348._12_4_;
        uVar17 = vcmpps_avx512vl(local_1358,auVar54,2);
        uVar18 = vcmpps_avx512vl(auVar59,local_1358,1);
        local_1337 = (byte)uVar17 & (byte)uVar18 & local_1337;
        if (local_1337 != 0) {
          auVar53 = vrcp14ps_avx512vl(local_1348);
          auVar55._8_4_ = 0x3f800000;
          auVar55._0_8_ = 0x3f8000003f800000;
          auVar55._12_4_ = 0x3f800000;
          auVar59 = vfnmadd213ps_avx512vl(local_1348,auVar53,auVar55);
          auVar53 = vfmadd132ps_fma(auVar59,auVar53,auVar53);
          fVar68 = auVar53._0_4_;
          fVar69 = auVar53._4_4_;
          fVar70 = auVar53._8_4_;
          fVar71 = auVar53._12_4_;
          local_1308[0] = fVar68 * local_1358._0_4_;
          local_1308[1] = fVar69 * local_1358._4_4_;
          local_1308[2] = fVar70 * local_1358._8_4_;
          local_1308[3] = fVar71 * local_1358._12_4_;
          local_1328[0] = fVar68 * local_1378._0_4_;
          local_1328[1] = fVar69 * local_1378._4_4_;
          local_1328[2] = fVar70 * local_1378._8_4_;
          local_1328[3] = fVar71 * local_1378._12_4_;
          local_1318._0_4_ = fVar68 * local_1368._0_4_;
          local_1318._4_4_ = fVar69 * local_1368._4_4_;
          local_1318._8_4_ = fVar70 * local_1368._8_4_;
          local_1318._12_4_ = fVar71 * local_1368._12_4_;
          local_14a0 = (ulong)local_1337;
          do {
            local_14a8 = 0;
            for (uVar29 = local_14a0; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000)
            {
              local_14a8 = local_14a8 + 1;
            }
            local_14b0 = (scene->geometries).items[*(uint *)((long)&local_1388 + local_14a8 * 4)].
                         ptr;
            if ((local_14b0->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              local_14a0 = local_14a0 ^ 1L << (local_14a8 & 0x3f);
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (local_14b0->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01d9ff1a:
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                goto LAB_01d9ff2b;
              }
              uVar29 = (ulong)(uint)((int)local_14a8 * 4);
              uVar2 = *(undefined4 *)((long)local_1328 + uVar29);
              local_1298._4_4_ = uVar2;
              local_1298._0_4_ = uVar2;
              local_1298._8_4_ = uVar2;
              local_1298._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(local_1318 + uVar29);
              local_1288._4_4_ = uVar2;
              local_1288._0_4_ = uVar2;
              local_1288._8_4_ = uVar2;
              local_1288._12_4_ = uVar2;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_1308 + uVar29);
              args.context = context->user;
              local_1268 = vpbroadcastd_avx512vl();
              uVar2 = *(undefined4 *)((long)&local_1398 + uVar29);
              local_1278._4_4_ = uVar2;
              local_1278._0_4_ = uVar2;
              local_1278._8_4_ = uVar2;
              local_1278._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(local_12f8 + uVar29);
              uVar4 = *(undefined4 *)(local_12e8 + uVar29);
              local_12b8._4_4_ = uVar4;
              local_12b8._0_4_ = uVar4;
              local_12b8._8_4_ = uVar4;
              local_12b8._12_4_ = uVar4;
              uVar4 = *(undefined4 *)(local_12d8 + uVar29);
              local_12a8._4_4_ = uVar4;
              local_12a8._0_4_ = uVar4;
              local_12a8._8_4_ = uVar4;
              local_12a8._12_4_ = uVar4;
              local_12c8[0] = (RTCHitN)(char)uVar2;
              local_12c8[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
              local_12c8[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
              local_12c8[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
              local_12c8[4] = (RTCHitN)(char)uVar2;
              local_12c8[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
              local_12c8[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
              local_12c8[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
              local_12c8[8] = (RTCHitN)(char)uVar2;
              local_12c8[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
              local_12c8[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
              local_12c8[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
              local_12c8[0xc] = (RTCHitN)(char)uVar2;
              local_12c8[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
              local_12c8[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
              local_12c8[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
              vpcmpeqd_avx2(ZEXT1632(local_1268),ZEXT1632(local_1268));
              uStack_1254 = (args.context)->instID[0];
              local_1258 = uStack_1254;
              uStack_1250 = uStack_1254;
              uStack_124c = uStack_1254;
              uStack_1248 = (args.context)->instPrimID[0];
              uStack_1244 = uStack_1248;
              uStack_1240 = uStack_1248;
              uStack_123c = uStack_1248;
              args.valid = (int *)local_14c8;
              args.geometryUserPtr = local_14b0->userPtr;
              args.hit = local_12c8;
              args.N = 4;
              local_14c8 = auVar41;
              args.ray = (RTCRayN *)ray;
              if (local_14b0->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*local_14b0->occlusionFilterN)(&args);
              }
              uVar29 = vptestmd_avx512vl(local_14c8,local_14c8);
              if ((uVar29 & 0xf) != 0) {
                p_Var11 = context->args->filter;
                if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                    (((local_14b0->field_8).field_0x2 & 0x40) != 0)))) {
                  (*p_Var11)(&args);
                }
                uVar29 = vptestmd_avx512vl(local_14c8,local_14c8);
                uVar29 = uVar29 & 0xf;
                auVar53 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar12 = (bool)((byte)uVar29 & 1);
                auVar51._0_4_ =
                     (uint)bVar12 * auVar53._0_4_ | (uint)!bVar12 * *(int *)(args.ray + 0x80);
                bVar12 = (bool)((byte)(uVar29 >> 1) & 1);
                auVar51._4_4_ =
                     (uint)bVar12 * auVar53._4_4_ | (uint)!bVar12 * *(int *)(args.ray + 0x84);
                bVar12 = (bool)((byte)(uVar29 >> 2) & 1);
                auVar51._8_4_ =
                     (uint)bVar12 * auVar53._8_4_ | (uint)!bVar12 * *(int *)(args.ray + 0x88);
                bVar12 = SUB81(uVar29 >> 3,0);
                auVar51._12_4_ =
                     (uint)bVar12 * auVar53._12_4_ | (uint)!bVar12 * *(int *)(args.ray + 0x8c);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar51;
                if ((byte)uVar29 != 0) goto LAB_01d9ff1a;
              }
              *(float *)(ray + k * 4 + 0x80) = fVar3;
              local_14a0 = local_14a0 ^ 1L << (local_14a8 & 0x3f);
              auVar76 = ZEXT3264(auVar76._0_32_);
              auVar77 = ZEXT3264(auVar77._0_32_);
              auVar78 = ZEXT3264(auVar78._0_32_);
              auVar79 = ZEXT3264(auVar79._0_32_);
              auVar80 = ZEXT3264(auVar80._0_32_);
            }
          } while (local_14a0 != 0);
        }
      }
      auVar72 = ZEXT3264(local_11f8);
      auVar73 = ZEXT3264(local_1218);
      auVar74 = ZEXT3264(local_1238);
      uVar29 = local_1488;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }